

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O0

void __thiscall
TPZEquationFilter::Gather(TPZEquationFilter *this,TPZBaseMatrix *large,TPZBaseMatrix *gathered)

{
  TPZFMatrix<double> *pTVar1;
  long in_RDX;
  TPZFMatrix<std::complex<double>_> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZFMatrix<std::complex<double>_> *gathered_cast_cstate;
  TPZFMatrix<std::complex<double>_> *large_cast_cstate;
  TPZFMatrix<double> *gathered_cast_state;
  TPZFMatrix<double> *large_cast_state;
  size_t in_stack_00000398;
  char *in_stack_000003a0;
  TPZFMatrix<std::complex<double>_> *local_80;
  TPZEquationFilter *local_70;
  long local_60;
  TPZFMatrix<double> *pTVar2;
  TPZFMatrix<std::complex<double>_> *pTVar3;
  
  pTVar3 = in_RSI;
  if (in_RSI == (TPZFMatrix<std::complex<double>_> *)0x0) {
    pTVar1 = (TPZFMatrix<double> *)0x0;
  }
  else {
    pTVar1 = (TPZFMatrix<double> *)
             __dynamic_cast(in_RSI,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
  }
  pTVar2 = pTVar1;
  if (in_RDX == 0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(in_RDX,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
  }
  if ((pTVar1 == (TPZFMatrix<double> *)0x0) || (local_60 == 0)) {
    if (in_RSI == (TPZFMatrix<std::complex<double>_> *)0x0) {
      local_70 = (TPZEquationFilter *)0x0;
    }
    else {
      local_70 = (TPZEquationFilter *)
                 __dynamic_cast(in_RSI,&TPZBaseMatrix::typeinfo,
                                &TPZFMatrix<std::complex<double>>::typeinfo,0);
    }
    if (in_RDX == 0) {
      local_80 = (TPZFMatrix<std::complex<double>_> *)0x0;
    }
    else {
      local_80 = (TPZFMatrix<std::complex<double>_> *)
                 __dynamic_cast(in_RDX,&TPZBaseMatrix::typeinfo,
                                &TPZFMatrix<std::complex<double>>::typeinfo,0);
    }
    if ((local_70 == (TPZEquationFilter *)0x0) ||
       (local_80 == (TPZFMatrix<std::complex<double>_> *)0x0)) {
      std::operator<<((ostream *)&std::cerr,
                      "void TPZEquationFilter::Gather(const TPZBaseMatrix &, TPZBaseMatrix &) const"
                     );
      std::operator<<((ostream *)&std::cerr," Incompatible types. Aborting...\n");
      pzinternal::DebugStopImpl(in_stack_000003a0,in_stack_00000398);
    }
    else {
      GatherInternal<std::complex<double>>(local_70,local_80,pTVar3);
    }
  }
  else {
    GatherInternal<double>((TPZEquationFilter *)pTVar3,in_RDI,pTVar2);
  }
  return;
}

Assistant:

void TPZEquationFilter::Gather(const TPZBaseMatrix &large, TPZBaseMatrix &gathered) const {
  auto *large_cast_state = dynamic_cast<const TPZFMatrix<STATE> *>(&large);
  auto *gathered_cast_state = dynamic_cast<TPZFMatrix<STATE> *>(&gathered);
  if (large_cast_state && gathered_cast_state) {
    return GatherInternal(*large_cast_state, *gathered_cast_state);
  }
  auto *large_cast_cstate = dynamic_cast<const TPZFMatrix<CSTATE> *>(&large);
  auto *gathered_cast_cstate = dynamic_cast<TPZFMatrix<CSTATE> *>(&gathered);
  if (large_cast_cstate && gathered_cast_cstate) {
    return GatherInternal(*large_cast_cstate, *gathered_cast_cstate);
  }

  PZError << __PRETTY_FUNCTION__;
  PZError << " Incompatible types. Aborting...\n";
  DebugStop();
}